

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

Var __thiscall
Js::TypedArray<float,_false,_false>::TypedDirectGetItemWithCheck
          (TypedArray<float,_false,_false> *this,uint32 index)

{
  float fVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  ArrayBufferBase *pAVar6;
  undefined4 *puVar7;
  ScriptContext *pSVar8;
  JavascriptLibrary *this_00;
  float *typedBuffer;
  uint32 index_local;
  TypedArray<float,_false,_false> *this_local;
  
  bVar3 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if (bVar3) {
    pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(pSVar8,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  uVar4 = ArrayObject::GetLength((ArrayObject *)this);
  if (index < uVar4) {
    uVar4 = Js::TypedArrayBase::GetByteOffset(&this->super_TypedArrayBase);
    pAVar6 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
    uVar5 = (*(pAVar6->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar5 < (ulong)(index + 1) * 4 + (ulong)uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x139,
                                  "((index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    fVar1 = *(float *)((this->super_TypedArrayBase).buffer + (ulong)index * 4);
    pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_local = (TypedArray<float,_false,_false> *)
                 JavascriptNumber::ToVarWithCheck((double)fVar1,pSVar8);
  }
  else {
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_local = (TypedArray<float,_false,_false> *)
                 JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  }
  return this_local;
}

Assistant:

inline Var TypedDirectGetItemWithCheck(__in uint32 index)
        {
            if (this->IsDetachedBuffer()) // 9.4.5.8 IntegerIndexedElementGet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            if (index < GetLength())
            {
                Assert((index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
                TypeName* typedBuffer = (TypeName*)buffer;
                return JavascriptNumber::ToVarWithCheck(typedBuffer[index], GetScriptContext());
            }
            return GetLibrary()->GetUndefined();
        }